

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32Ramp.cpp
# Opt level: O0

void __thiscall MT32Emu::LA32Ramp::startRamp(LA32Ramp *this,Bit8u target,Bit8u increment)

{
  Tables *pTVar1;
  Bit32u expArg;
  Bit8u increment_local;
  Bit8u target_local;
  LA32Ramp *this_local;
  
  if (increment == '\0') {
    this->largeIncrement = 0;
  }
  else {
    pTVar1 = Tables::getInstance();
    this->largeIncrement = 0x1fff - pTVar1->exp9[((increment & 0x7f) << 6 ^ 0xffffffff) & 0x1ff];
    this->largeIncrement = this->largeIncrement << (sbyte)((increment & 0x7f) >> 3);
    this->largeIncrement = this->largeIncrement + 0x40;
    this->largeIncrement = this->largeIncrement >> 9;
  }
  this->descending = (increment & 0x80) != 0;
  if ((this->descending & 1U) != 0) {
    this->largeIncrement = this->largeIncrement + 1;
  }
  this->largeTarget = (uint)target << 0x12;
  this->interruptCountdown = 0;
  this->interruptRaised = false;
  return;
}

Assistant:

void LA32Ramp::startRamp(Bit8u target, Bit8u increment) {
	// CONFIRMED: From sample analysis, this appears to be very accurate.
	if (increment == 0) {
		largeIncrement = 0;
	} else {
		// Three bits in the fractional part, no need to interpolate
		// (unsigned int)(EXP2F(((increment & 0x7F) + 24) / 8.0f) + 0.125f)
		Bit32u expArg = increment & 0x7F;
		largeIncrement = 8191 - Tables::getInstance().exp9[~(expArg << 6) & 511];
		largeIncrement <<= expArg >> 3;
		largeIncrement += 64;
		largeIncrement >>= 9;
	}
	descending = (increment & 0x80) != 0;
	if (descending) {
		// CONFIRMED: From sample analysis, descending increments are slightly faster
		largeIncrement++;
	}

	largeTarget = target << TARGET_SHIFTS;
	interruptCountdown = 0;
	interruptRaised = false;
}